

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O0

void test_pos<wchar_t>(string *source,
                      basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                      *target,string *encoding)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  wchar_t *pwVar9;
  ostream *this;
  runtime_error *this_00;
  string *s;
  int iVar10;
  method_type in_EDX;
  locale l;
  generator g;
  char *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  allocator *paVar11;
  string *in_stack_fffffffffffff998;
  runtime_error *in_stack_fffffffffffff9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  string *in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  method_type how;
  ostream *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  wchar_t *in_stack_fffffffffffff9f8;
  allocator local_3d9;
  string local_3d8 [32];
  string local_3b8 [38];
  undefined1 local_392;
  allocator local_391;
  string local_390 [32];
  string local_370 [38];
  undefined1 local_34a;
  allocator local_349;
  string local_348 [32];
  string local_328 [38];
  undefined1 local_302;
  allocator local_301;
  string local_300 [32];
  string local_2e0 [38];
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [32];
  string local_250 [38];
  undefined1 local_22a;
  allocator local_229;
  string local_228 [32];
  wstring local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  wstring local_1c0 [38];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [32];
  wstring local_178 [38];
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  wstring local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  wstring local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  wstring local_a0 [39];
  byte local_79;
  string local_78 [35];
  byte local_55;
  string local_48 [32];
  locale local_28 [8];
  generator local_20 [32];
  
  how = (method_type)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  booster::locale::generator::generator(local_20);
  bVar1 = std::operator==(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  local_55 = 0;
  local_79 = 0;
  if (bVar1) {
    std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    local_55 = 1;
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  }
  else {
    std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    local_79 = 1;
    booster::locale::generator::operator()
              ((generator *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  }
  if ((local_79 & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string(local_48);
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            (in_stack_fffffffffffff9b8,
             (string *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
             (method_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_a0);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb5);
    poVar4 = std::operator<<(poVar4," to_utf<Char>(source,encoding)==target");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_c2 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"Error limits reached, stopping unit test",&local_c1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_c2 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::c_str();
  booster::locale::conv::to_utf<wchar_t>
            ((char *)in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0,
             (method_type)((ulong)in_stack_fffffffffffff998 >> 0x20));
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_e8);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb6);
    poVar4 = std::operator<<(poVar4," to_utf<Char>(source.c_str(),encoding)==target");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_10a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Error limits reached, stopping unit test",&local_109);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_10a = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  lVar7 = std::__cxx11::string::c_str();
  lVar8 = std::__cxx11::string::size();
  booster::locale::conv::to_utf<wchar_t>((char *)local_130,pcVar6,(string *)(lVar7 + lVar8),in_EDX);
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_130);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb7);
    poVar4 = std::operator<<(poVar4,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_152 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"Error limits reached, stopping unit test",&local_151);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_152 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::to_utf<wchar_t>
            (in_stack_fffffffffffff9b8,
             (locale *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
             (method_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_178);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb9);
    poVar4 = std::operator<<(poVar4," to_utf<Char>(source,l)==target");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_19a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"Error limits reached, stopping unit test",&local_199);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_19a = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::c_str();
  booster::locale::conv::to_utf<wchar_t>
            ((char *)in_stack_fffffffffffff9a8,(locale *)in_stack_fffffffffffff9a0,
             (method_type)((ulong)in_stack_fffffffffffff998 >> 0x20));
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_1c0);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xba);
    poVar4 = std::operator<<(poVar4," to_utf<Char>(source.c_str(),l)==target");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_1e2 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"Error limits reached, stopping unit test",&local_1e1);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_1e2 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  booster::locale::conv::to_utf<wchar_t>
            ((char *)in_stack_fffffffffffff9f8,
             (char *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
             (locale *)in_stack_fffffffffffff9e8,how);
  _Var2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)in_stack_fffffffffffff9a8);
  std::__cxx11::wstring::~wstring(local_208);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbb);
    poVar4 = std::operator<<(poVar4,
                             " to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target")
    ;
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_22a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"Error limits reached, stopping unit test",&local_229);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_22a = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff9b8,
             (string *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
             (method_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_250);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbd);
    poVar4 = std::operator<<(poVar4," from_utf<Char>(target,encoding)==source");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_272 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"Error limits reached, stopping unit test",&local_271);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_272 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0,
             (method_type)((ulong)in_stack_fffffffffffff998 >> 0x20));
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_298);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbe);
    poVar4 = std::operator<<(poVar4," from_utf<Char>(target.c_str(),encoding)==source");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_2ba = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,"Error limits reached, stopping unit test",&local_2b9);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_2ba = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar9 = (wchar_t *)std::__cxx11::wstring::c_str();
  lVar7 = std::__cxx11::wstring::c_str();
  lVar8 = std::__cxx11::wstring::size();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)local_2e0,pwVar9,(string *)(lVar7 + lVar8 * 4),in_EDX);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_2e0);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbf);
    poVar4 = std::operator<<(poVar4,
                             " from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_302 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"Error limits reached, stopping unit test",&local_301);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_302 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff9b8,
             (locale *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
             (method_type)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_328);
  if (!_Var2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc1);
    poVar4 = std::operator<<(poVar4," from_utf<Char>(target,l)==source");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_34a = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,"Error limits reached, stopping unit test",&local_349);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_34a = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)in_stack_fffffffffffff9a8,(locale *)in_stack_fffffffffffff9a0,
             (method_type)((ulong)in_stack_fffffffffffff998 >> 0x20));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_370);
  if ((bVar3 & 1) == 0) {
    in_stack_fffffffffffff9e8 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9e8,0xc2);
    this = std::operator<<(poVar4," from_utf<Char>(target.c_str(),l)==source");
    how = (method_type)((ulong)poVar4 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      local_392 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      paVar11 = &local_391;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"Error limits reached, stopping unit test",paVar11);
      booster::runtime_error::runtime_error(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      local_392 = 0;
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_fffffffffffff9f8,(wchar_t *)CONCAT17(bVar3,in_stack_fffffffffffff9f0),
             (locale *)in_stack_fffffffffffff9e8,how);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                          in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_3b8);
  if ((bVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    this_00 = (runtime_error *)std::ostream::operator<<(poVar4,0xc3);
    s = (string *)
        std::operator<<((ostream *)this_00,
                        " from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source");
    std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
    iVar10 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar10;
    if (bVar1) {
      uVar5 = __cxa_allocate_exception(0x30);
      paVar11 = &local_3d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,"Error limits reached, stopping unit test",paVar11);
      booster::runtime_error::runtime_error(this_00,s);
      __cxa_throw(uVar5,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale(local_28);
  booster::locale::generator::~generator(local_20);
  return;
}

Assistant:

void test_pos(std::string source,std::basic_string<Char> target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l= encoding == "ISO8859-8" ? g("he_IL."+encoding) : g("en_US."+encoding);
    TEST(to_utf<Char>(source,encoding)==target);
    TEST(to_utf<Char>(source.c_str(),encoding)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    
    TEST(to_utf<Char>(source,l)==target);
    TEST(to_utf<Char>(source.c_str(),l)==target);
    TEST(to_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TEST(from_utf<Char>(target,encoding)==source);
    TEST(from_utf<Char>(target.c_str(),encoding)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),encoding)==source);
    
    TEST(from_utf<Char>(target,l)==source);
    TEST(from_utf<Char>(target.c_str(),l)==source);
    TEST(from_utf<Char>(target.c_str(),target.c_str()+target.size(),l)==source);
}